

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp_s.c
# Opt level: O0

errno_t memcmp_s(void *dest,rsize_t dmax,void *src,rsize_t smax,int *diff)

{
  long lVar1;
  undefined4 uVar2;
  ulong in_RCX;
  byte *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  undefined4 *in_R8;
  long in_FS_OFFSET;
  uint8_t *sp;
  uint8_t *dp;
  errno_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  byte *local_40;
  ulong local_30;
  ulong local_20;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == (undefined4 *)0x0) {
    invoke_safe_mem_constraint_handler
              ((char *)in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    local_c = 400;
  }
  else {
    *in_R8 = 0xffffffff;
    if (in_RDI == (byte *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RDX == (byte *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)0x0,(void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 0x191;
    }
    else if (in_RSI < 0x10000001) {
      if (in_RCX == 0) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_RDX,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        local_c = 0x191;
      }
      else if (in_RSI < in_RCX) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_RDX,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        local_c = 0x193;
      }
      else if (in_RDI == in_RDX) {
        *in_R8 = 0;
        local_c = 0;
      }
      else {
        *in_R8 = 0;
        local_40 = in_RDI;
        local_30 = in_RCX;
        for (local_20 = in_RSI; local_20 != 0 && local_30 != 0; local_20 = local_20 - 1) {
          if (*local_40 != *in_RDX) {
            uVar2 = 1;
            if (*local_40 < *in_RDX) {
              uVar2 = 0xffffffff;
            }
            *in_R8 = uVar2;
            break;
          }
          local_30 = local_30 - 1;
          local_40 = local_40 + 1;
          in_RDX = in_RDX + 1;
        }
        local_c = 0;
      }
    }
    else {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 0x193;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcmp_s (const void *dest, rsize_t dmax,
          const void *src,  rsize_t smax, int *diff)
{
    const uint8_t *dp;
    const uint8_t *sp;

    dp = dest;
    sp = src;

    /*
     * must be able to return the diff
     */
    if (diff == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: diff is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }
    *diff = -1;  /* default diff */

    if (dp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (sp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: src is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcmp_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memcmp_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        invoke_safe_mem_constraint_handler("memcmp_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
        invoke_safe_mem_constraint_handler("memcmp_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    /*
     * no need to compare the same memory
     */
    if (dp == sp) {
        *diff = 0;
        return (RCNEGATE(EOK));
    }

    /*
     * now compare sp to dp
     */
    *diff = 0;
    while (dmax > 0 && smax > 0) {
        if (*dp != *sp) {
            /***  *diff = *dp - *sp; ***/
            *diff = *dp < *sp ? -1 : 1;
            break;
        }

        dmax--;
        smax--;

        dp++;
        sp++;
    }

    return (RCNEGATE(EOK));
}